

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O2

string * __thiscall
GrcManager::ProcessClassList_abi_cxx11_
          (string *__return_storage_ptr__,GrcManager *this,RefAST *ast,RefAST *pastNext)

{
  GrcSymbolTable *this_00;
  RefAST *pRVar1;
  int iVar2;
  uint uVar3;
  Symbol this_01;
  GdlGlyphClassDefn *pglfc;
  string *staClassName;
  RefAST astGlyph;
  undefined1 local_98 [40];
  RefAST *local_70;
  RefCount<AST> local_68;
  RefCount<AST> local_60;
  RefAST local_58;
  string local_50 [32];
  
  local_70 = pastNext;
  iVar2 = AST::getType(ast->ref->ptr);
  if (iVar2 == 0xd) {
    AST::getNextSibling(ast->ref->ptr);
    pRVar1 = local_70;
    RefCount<AST>::operator=(local_70,(RefCount<AST> *)local_98);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_98);
    if ((pRVar1->ref == (Ref *)0x0) || (pRVar1->ref->ptr == (AST *)0x0)) {
      AST::getText_abi_cxx11_(__return_storage_ptr__,ast->ref->ptr);
      return __return_storage_ptr__;
    }
    AST::getNextSibling(ast->ref->ptr);
    uVar3 = AST::getType(*(AST **)local_98._0_8_);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_98);
    if ((0x1f < uVar3) || ((0xf4002000U >> (uVar3 & 0x1f) & 1) == 0)) {
      AST::getText_abi_cxx11_((string *)local_98,ast->ref->ptr);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)local_98._0_8_,(allocator *)&local_68);
      std::__cxx11::string::~string((string *)local_98);
      if ((uVar3 != 0xd) && (uVar3 != 0x1a)) {
        return __return_storage_ptr__;
      }
    }
  }
  this_00 = this->m_psymtbl;
  local_58 = (RefAST)ast->ref;
  if (local_58.ref != (Ref *)0x0) {
    (local_58.ref)->count = (local_58.ref)->count + 1;
  }
  LineAndFile((GrpLineAndFile *)local_98,this,&local_58);
  this_01 = GrcSymbolTable::AddAnonymousClassSymbol(this_00,(GrpLineAndFile *)local_98);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  RefCount<AST>::~RefCount(&local_58);
  GrcSymbolTableEntry::FullName_abi_cxx11_(__return_storage_ptr__,this_01);
  pglfc = GrcSymbolTableEntry::GlyphClassDefnData(this_01);
  std::__cxx11::string::string(local_50,(string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
  std::__cxx11::string::~string(local_50);
  GdlRenderer::AddGlyphClass(this->m_prndr,pglfc);
  local_98._0_8_ = ast->ref;
  if ((Ref *)local_98._0_8_ != (Ref *)0x0) {
    ((Ref *)local_98._0_8_)->count = ((Ref *)local_98._0_8_)->count + 1;
  }
  while ((((Ref *)local_98._0_8_ != (Ref *)0x0 && (*(AST **)local_98._0_8_ != (AST *)0x0)) &&
         (((uVar3 = AST::getType(*(AST **)local_98._0_8_), uVar3 < 0x20 &&
           ((0xf4002000U >> (uVar3 & 0x1f) & 1) != 0)) || (uVar3 == 0x65))))) {
    if ((Ref *)local_98._0_8_ != (Ref *)0x0) {
      *(uint *)(local_98._0_8_ + 8) = *(uint *)(local_98._0_8_ + 8) + 1;
    }
    local_60.ref = (Ref *)local_98._0_8_;
    ProcessGlyphClassMember(this,&local_60,pglfc,kglfctUnion,(GdlGlyphDefn **)0x0);
    RefCount<AST>::~RefCount(&local_60);
    AST::getNextSibling(*(AST **)local_98._0_8_);
    RefCount<AST>::operator=((RefCount<AST> *)local_98,&local_68);
    RefCount<AST>::~RefCount(&local_68);
  }
  RefCount<AST>::operator=(local_70,(RefCount<AST> *)local_98);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string GrcManager::ProcessClassList(RefAST ast, RefAST * pastNext)
{
	if (ast->getType() == IDENT)
	{
		*pastNext = ast->getNextSibling();
		//	If only one class in the list, just return its name.
		if (!*pastNext)
			return ast->getText();
		int nextNodeTyp = ast->getNextSibling()->getType();
		if (nextNodeTyp != IDENT && nextNodeTyp != LITERAL_glyphid &&
			nextNodeTyp != LITERAL_unicode && nextNodeTyp != LITERAL_codepoint &&
			nextNodeTyp != LITERAL_postscript && nextNodeTyp != LITERAL_pseudo)
		{
			return ast->getText().c_str();
		}
	}

	Symbol psymClass = SymbolTable()->AddAnonymousClassSymbol(LineAndFile(ast));

	std::string staClassName = psymClass->FullName();
	GdlGlyphClassDefn * pglfc = psymClass->GlyphClassDefnData();
	Assert(pglfc);
	pglfc->SetName(staClassName);
	m_prndr->AddGlyphClass(pglfc);

	int nodetyp;
	RefAST astGlyph = ast;
	while (astGlyph &&
		((nodetyp = astGlyph->getType()) == IDENT ||
			nodetyp == LITERAL_glyphid ||
			nodetyp == LITERAL_unicode || nodetyp == LITERAL_codepoint || nodetyp == ZuHex ||
			nodetyp == LITERAL_postscript || nodetyp == LITERAL_pseudo))
	{
		ProcessGlyphClassMember(astGlyph, pglfc, kglfctUnion, NULL);
		astGlyph = astGlyph->getNextSibling();
	}
	*pastNext = astGlyph;

	return staClassName;
}